

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

MPP_RET name_to_coding_type(char *name,MppCodingType *coding)

{
  int iVar1;
  MPP_RET MVar2;
  long lVar3;
  char ext [50];
  char acStack_68 [64];
  
  get_extension(name,acStack_68);
  MVar2 = MPP_NOK;
  lVar3 = 8;
  do {
    iVar1 = strcmp(acStack_68,*(char **)((long)&map_ext_to_frm_fmt[0x10].format + lVar3));
    if (iVar1 == 0) {
      *coding = *(MppCodingType *)((long)&map_ext_to_coding[0].ext_name + lVar3);
      MVar2 = MPP_OK;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x98);
  return MVar2;
}

Assistant:

MPP_RET name_to_coding_type(const char *name, MppCodingType *coding)
{
    RK_U32 i;
    MPP_RET ret = MPP_NOK;
    char ext[50];

    get_extension(name, ext);

    for (i = 0; i < MPP_ARRAY_ELEMS(map_ext_to_coding); i++) {
        Ext2Coding *info = &map_ext_to_coding[i];

        if (!strcmp(ext, info->ext_name)) {
            *coding = info->coding;
            ret = MPP_OK;
        }
    }

    return ret;
}